

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void set_compressed(parser *par)

{
  io_buf *piVar1;
  
  finalize_source(par);
  if (par->input != (io_buf *)0x0) {
    (*par->input->_vptr_io_buf[3])();
  }
  piVar1 = (io_buf *)operator_new(0xc0);
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002d7d50;
  (piVar1->space)._begin = (char *)0x0;
  (piVar1->space)._end = (char *)0x0;
  (piVar1->space).end_array = (char *)0x0;
  (piVar1->space).erase_count = 0;
  (piVar1->files)._begin = (int *)0x0;
  (piVar1->files)._end = (int *)0x0;
  (piVar1->files).end_array = (int *)0x0;
  (piVar1->files).erase_count = 0;
  (piVar1->currentname)._begin = (char *)0x0;
  (piVar1->currentname)._end = (char *)0x0;
  (piVar1->currentname).end_array = (char *)0x0;
  (piVar1->currentname).erase_count = 0;
  (piVar1->finalname)._begin = (char *)0x0;
  (piVar1->finalname)._end = (char *)0x0;
  (piVar1->finalname).end_array = (char *)0x0;
  (piVar1->finalname).erase_count = 0;
  v_array<char>::resize(&piVar1->space,0x10000);
  piVar1->count = 0;
  piVar1->current = 0;
  piVar1->head = (piVar1->space)._begin;
  piVar1->_verify_hash = false;
  piVar1->_hash = 0;
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002d9800;
  piVar1[1]._vptr_io_buf = (_func_int **)0x0;
  piVar1[1]._verify_hash = false;
  *(undefined3 *)&piVar1[1].field_0x9 = 0;
  piVar1[1]._hash = 0;
  piVar1[1].space._begin = (char *)0x0;
  par->input = piVar1;
  if (par->output != (io_buf *)0x0) {
    (*par->output->_vptr_io_buf[3])();
  }
  piVar1 = (io_buf *)operator_new(0xc0);
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002d7d50;
  (piVar1->space)._begin = (char *)0x0;
  (piVar1->space)._end = (char *)0x0;
  (piVar1->space).end_array = (char *)0x0;
  (piVar1->space).erase_count = 0;
  (piVar1->files)._begin = (int *)0x0;
  (piVar1->files)._end = (int *)0x0;
  (piVar1->files).end_array = (int *)0x0;
  (piVar1->files).erase_count = 0;
  (piVar1->currentname)._begin = (char *)0x0;
  (piVar1->currentname)._end = (char *)0x0;
  (piVar1->currentname).end_array = (char *)0x0;
  (piVar1->currentname).erase_count = 0;
  (piVar1->finalname)._begin = (char *)0x0;
  (piVar1->finalname)._end = (char *)0x0;
  (piVar1->finalname).end_array = (char *)0x0;
  (piVar1->finalname).erase_count = 0;
  v_array<char>::resize(&piVar1->space,0x10000);
  piVar1->count = 0;
  piVar1->current = 0;
  piVar1->head = (piVar1->space)._begin;
  piVar1->_verify_hash = false;
  piVar1->_hash = 0;
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002d9800;
  piVar1[1]._vptr_io_buf = (_func_int **)0x0;
  piVar1[1]._verify_hash = false;
  *(undefined3 *)&piVar1[1].field_0x9 = 0;
  piVar1[1]._hash = 0;
  piVar1[1].space._begin = (char *)0x0;
  par->output = piVar1;
  return;
}

Assistant:

void set_compressed(parser* par)
{
  finalize_source(par);
  delete par->input;
  par->input = new comp_io_buf;
  delete par->output;
  par->output = new comp_io_buf;
}